

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void composition_source(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (const_alpha != 0xff) {
    if (0 < length) {
      uVar2 = 0;
      do {
        uVar1 = (dest[uVar2] & 0xff00ff) * (0xff - const_alpha) +
                (src[uVar2] & 0xff00ff) * const_alpha;
        uVar3 = (dest[uVar2] >> 8 & 0xff00ff) * (0xff - const_alpha) +
                (src[uVar2] >> 8 & 0xff00ff) * const_alpha;
        dest[uVar2] = uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) & 0xff00ff00 |
                      uVar1 + 0x800080 + (uVar1 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
        uVar2 = uVar2 + 1;
      } while ((uint)length != uVar2);
    }
    return;
  }
  memcpy(dest,src,(long)length << 2);
  return;
}

Assistant:

static void composition_source(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        memcpy(dest, src, length * sizeof(uint32_t));
    } else {
        uint32_t ialpha = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            dest[i] = INTERPOLATE_PIXEL(src[i], const_alpha, dest[i], ialpha);
        }
    }
}